

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

TimeSamples * __thiscall
tinyusdz::tydra::(anonymous_namespace)::ToTypelessTimeSamples<std::array<float,2ul>>
          (TimeSamples *__return_storage_ptr__,_anonymous_namespace_ *this,
          TypedTimeSamples<std::array<float,_2UL>_> *ts)

{
  double t;
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  Value local_48;
  ulong local_30;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  *local_20;
  vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
  *samples;
  TypedTimeSamples<std::array<float,_2UL>_> *ts_local;
  TimeSamples *dst;
  
  samples = (vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
             *)this;
  ts_local = (TypedTimeSamples<std::array<float,_2UL>_> *)__return_storage_ptr__;
  local_20 = TypedTimeSamples<std::array<float,_2UL>_>::get_samples
                       ((TypedTimeSamples<std::array<float,_2UL>_> *)this);
  i._7_1_ = 0;
  tinyusdz::value::TimeSamples::TimeSamples(__return_storage_ptr__);
  for (local_30 = 0; uVar1 = local_30,
      sVar2 = ::std::
              vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
              ::size(local_20), uVar1 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
             ::operator[](local_20,local_30);
    t = pvVar3->t;
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::array<float,_2UL>_>::Sample>_>
             ::operator[](local_20,local_30);
    tinyusdz::value::Value::Value<std::array<float,2ul>>(&local_48,&pvVar3->value);
    tinyusdz::value::TimeSamples::add_sample(__return_storage_ptr__,t,&local_48);
    tinyusdz::value::Value::~Value(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

value::TimeSamples ToTypelessTimeSamples(const TypedTimeSamples<T> &ts) {
  const std::vector<typename TypedTimeSamples<T>::Sample> &samples =
      ts.get_samples();

  value::TimeSamples dst;

  for (size_t i = 0; i < samples.size(); i++) {
    dst.add_sample(samples[i].t, samples[i].value);
  }

  return dst;
}